

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class_table.c
# Opt level: O1

int objc_getClassList(Class *buffer,int bufferLen)

{
  Class poVar1;
  uint uVar2;
  ulong uVar3;
  class_table_internal_table_enumerator *e;
  class_table_internal_table_enumerator *local_28;
  ulong uVar4;
  
  if (buffer == (Class *)0x0 || bufferLen == 0) {
    uVar2 = class_table->table_used;
  }
  else {
    local_28 = (class_table_internal_table_enumerator *)0x0;
    if (bufferLen < 1) {
      uVar4 = 0;
    }
    else {
      uVar3 = 0;
      do {
        poVar1 = (Class)class_table_internal_next(class_table,&local_28);
        uVar4 = uVar3;
        if (poVar1 == (Class)0x0) break;
        buffer[uVar3] = poVar1;
        uVar3 = uVar3 + 1;
        uVar4 = (ulong)(uint)bufferLen;
      } while ((uint)bufferLen != uVar3);
    }
    uVar2 = (uint)uVar4;
    free(local_28);
  }
  return uVar2;
}

Assistant:

int objc_getClassList(Class *buffer, int bufferLen)
{
	if (buffer == NULL || bufferLen == 0)
	{
		return class_table->table_used;
	}
	int count = 0;
	struct class_table_internal_table_enumerator *e = NULL;
	Class next;
	while (count < bufferLen &&
		(next = class_table_internal_next(class_table, &e)))
	{
		buffer[count++] = next;
	}
	free(e);
	return count;
}